

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * ON_Font::Internal_BestMatchWeightStretchStyle
                    (Weight prefered_weight,Stretch prefered_stretch,Style prefered_style,
                    ON_Font **font_list,size_t font_count)

{
  ON_Font *available_font;
  uint uVar1;
  ON_Font *pOVar2;
  ON_Font *pOVar3;
  size_t i;
  size_t sVar4;
  uint uVar5;
  
  if (font_count == 0 || font_list == (ON_Font **)0x0) {
    pOVar2 = (ON_Font *)0x0;
  }
  else {
    uVar5 = 0xffffffff;
    pOVar2 = (ON_Font *)0x0;
    for (sVar4 = 0; font_count != sVar4; sVar4 = sVar4 + 1) {
      available_font = font_list[sVar4];
      pOVar3 = pOVar2;
      uVar1 = uVar5;
      if (available_font != (ON_Font *)0x0) {
        uVar1 = WeightStretchStyleDeviation
                          (prefered_weight,prefered_stretch,prefered_style,available_font);
        if (uVar1 == 0) {
          return available_font;
        }
        pOVar3 = available_font;
        if (uVar5 <= uVar1 && pOVar2 != (ON_Font *)0x0) {
          pOVar3 = pOVar2;
          uVar1 = uVar5;
        }
      }
      uVar5 = uVar1;
      pOVar2 = pOVar3;
    }
  }
  return pOVar2;
}

Assistant:

const ON_Font* ON_Font::Internal_BestMatchWeightStretchStyle(
  ON_Font::Weight prefered_weight,
  ON_Font::Stretch prefered_stretch,
  ON_Font::Style prefered_style,
  ON_Font const * const * font_list, 
  size_t font_count
)
{
  if (nullptr == font_list || font_count <= 0)
    return nullptr;

  const ON_Font* best_font = nullptr;
  unsigned int best_delta = 0xFFFFFFFF;
  for (size_t i = 0; i < font_count; i++)
  {
    const ON_Font* font = font_list[i];
    if (nullptr == font)
      continue;
    const unsigned int delta = ON_Font::WeightStretchStyleDeviation(
      prefered_weight, 
      prefered_stretch, 
      prefered_style,
      font
    );
    if (0 == delta)
      return font;
    if (nullptr == best_font || delta < best_delta)
    {
      best_font = font;
      best_delta = delta;
    }
  }

  return best_font;
}